

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymMetaclass::add_runtime_symbol(CTcSymMetaclass *this,CVmRuntimeSymbols *symtab)

{
  tctarg_obj_id_t obj;
  CVmRuntimeSymbols *in_RSI;
  CTcSymMetaclassBase *in_RDI;
  vm_val_t val;
  size_t in_stack_ffffffffffffffe0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffe8;
  
  if ((in_RDI->field_0x58 & 1) == 0) {
    obj = CTcSymMetaclassBase::get_class_obj(in_RDI);
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffe0,obj);
    CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d9720);
    CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d972f);
    CVmRuntimeSymbols::add_sym
              (in_RSI,(char *)in_stack_ffffffffffffffe8.ptr,in_stack_ffffffffffffffe0,
               (vm_val_t *)in_RDI);
  }
  return;
}

Assistant:

void CTcSymMetaclass::add_runtime_symbol(CVmRuntimeSymbols *symtab)
{
    /* don't do this for external metaclasses */
    if (ext_)
        return;

    /* add our entry */
    vm_val_t val;
    val.set_obj(get_class_obj());
    symtab->add_sym(get_sym(), get_sym_len(), &val);
}